

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_dg.c
# Opt level: O0

_Bool svc_dg_control(SVCXPRT *xprt,u_int rq,void *in)

{
  void *in_local;
  u_int rq_local;
  SVCXPRT *xprt_local;
  
  switch(rq) {
  case 7:
    *(uint *)in = (uint)xprt->xp_flags;
    break;
  case 8:
    xprt->xp_flags = (uint16_t)*in;
    break;
  default:
    return false;
  case 0xf:
    pthread_mutex_lock((pthread_mutex_t *)&ops_lock);
    *(svc_xprt_fun_t *)in = xprt->xp_ops->xp_free_user_data;
    pthread_mutex_unlock((pthread_mutex_t *)&ops_lock);
    break;
  case 0x10:
    pthread_mutex_lock((pthread_mutex_t *)&ops_lock);
    xprt->xp_ops->xp_free_user_data = (svc_xprt_fun_t)in;
    pthread_mutex_unlock((pthread_mutex_t *)&ops_lock);
  }
  return true;
}

Assistant:

static bool
svc_dg_control(SVCXPRT *xprt, const u_int rq, void *in)
{
	switch (rq) {
	case SVCGET_XP_FLAGS:
		*(u_int *) in = xprt->xp_flags;
		break;
	case SVCSET_XP_FLAGS:
		xprt->xp_flags = *(u_int *) in;
		break;
	case SVCGET_XP_FREE_USER_DATA:
		mutex_lock(&ops_lock);
		*(svc_xprt_fun_t *) in = xprt->xp_ops->xp_free_user_data;
		mutex_unlock(&ops_lock);
		break;
	case SVCSET_XP_FREE_USER_DATA:
		mutex_lock(&ops_lock);
		xprt->xp_ops->xp_free_user_data = *(svc_xprt_fun_t) in;
		mutex_unlock(&ops_lock);
		break;
	default:
		return (false);
	}
	return (true);
}